

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall PlanTestPoolsWithDepthTwo::Run(PlanTestPoolsWithDepthTwo *this)

{
  value_type pEVar1;
  char cVar2;
  Test *pTVar3;
  int iVar4;
  bool bVar5;
  __type condition;
  int iVar6;
  Node *pNVar7;
  reference ppEVar8;
  reference ppNVar9;
  string *psVar10;
  char *__s;
  Edge *pEVar11;
  reference ppEVar12;
  Edge *last;
  undefined1 local_230 [8];
  iterator it;
  Edge *out3;
  Edge *edge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator<char> local_1b1;
  undefined1 local_1b0 [8];
  string base_name;
  Edge *edge_1;
  undefined1 local_180 [4];
  int i_1;
  deque<Edge_*,_std::allocator<Edge_*>_> edges;
  string local_128;
  undefined1 local_108 [8];
  string err;
  string local_e0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  ManifestParserOptions MStack_1c;
  int i;
  int local_14;
  PlanTestPoolsWithDepthTwo *pPStack_10;
  int fail_count;
  PlanTestPoolsWithDepthTwo *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&stack0xffffffffffffffe4);
  AssertParse(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_,
              "pool foobar\n  depth = 2\npool bazbin\n  depth = 2\nrule foocat\n  command = cat $in > $out\n  pool = foobar\nrule bazcat\n  command = cat $in > $out\n  pool = bazbin\nbuild out1: foocat in\nbuild out2: foocat in\nbuild out3: foocat in\nbuild outb1: bazcat in\nbuild outb2: bazcat in\nbuild outb3: bazcat in\n  pool =\nbuild allTheThings: cat out1 out2 out3 outb1 outb2 outb3\n"
              ,MStack_1c);
  iVar4 = local_14;
  iVar6 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar6) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      cVar2 = (char)local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,1,cVar2 + '1',&local_61);
      std::operator+(&local_40,"out",&local_60);
      pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_40);
      Node::MarkDirty(pNVar7);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      cVar2 = (char)local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,1,cVar2 + '1',&local_b9);
      std::operator+(&local_98,"outb",&local_b8);
      pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_98);
      Node::MarkDirty(pNVar7);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"allTheThings",
               (allocator<char> *)(err.field_2._M_local_buf + 0xf));
    pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_e0);
    Node::MarkDirty(pNVar7);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_108);
    pTVar3 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"allTheThings",
               (allocator<char> *)
               ((long)&edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 7));
    pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_128);
    bVar5 = Plan::AddTarget(&(this->super_PlanTest).plan_,pNVar7,(string *)local_108);
    testing::Test::Check
              (pTVar3,bVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x11e,"plan_.AddTarget(GetNode(\"allTheThings\"), &err)");
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 7));
    pTVar3 = g_current_test;
    bVar5 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
    bVar5 = testing::Test::Check
                      (pTVar3,bVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x11f,"\"\" == err");
    if (bVar5) {
      std::deque<Edge_*,_std::allocator<Edge_*>_>::deque
                ((deque<Edge_*,_std::allocator<Edge_*>_> *)local_180);
      PlanTest::FindWorkSorted
                (&this->super_PlanTest,(deque<Edge_*,_std::allocator<Edge_*>_> *)local_180,5);
      for (edge_1._4_4_ = 0; edge_1._4_4_ < 4; edge_1._4_4_ = edge_1._4_4_ + 1) {
        ppEVar8 = std::deque<Edge_*,_std::allocator<Edge_*>_>::operator[]
                            ((deque<Edge_*,_std::allocator<Edge_*>_> *)local_180,(long)edge_1._4_4_)
        ;
        pTVar3 = g_current_test;
        base_name.field_2._8_8_ = *ppEVar8;
        ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            (&((value_type)base_name.field_2._8_8_)->inputs_,0);
        psVar10 = Node::path_abi_cxx11_(*ppNVar9);
        bVar5 = std::operator==("in",psVar10);
        bVar5 = testing::Test::Check
                          (pTVar3,bVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x126,"\"in\" == edge->inputs_[0]->path()");
        if (!bVar5) {
          testing::Test::AddAssertionFailure(g_current_test);
          edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_node._0_4_ = 1;
          goto LAB_00129b39;
        }
        __s = "outb";
        if (edge_1._4_4_ < 2) {
          __s = "out";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,__s,&local_1b1);
        std::allocator<char>::~allocator(&local_1b1);
        pTVar3 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,1,
                   ((char)edge_1._4_4_ + '1') -
                   ((char)edge_1._4_4_ - (char)(edge_1._4_4_ >> 0x1f) & 0xfeU),
                   (allocator<char> *)((long)&edge + 7));
        std::operator+(&local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,&local_1f8);
        ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             (base_name.field_2._8_8_ + 0x28),0);
        psVar10 = Node::path_abi_cxx11_(*ppNVar9);
        condition = std::operator==(&local_1d8,psVar10);
        bVar5 = testing::Test::Check
                          (pTVar3,condition,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x128,
                           "base_name + string(1, \'1\' + (i % 2)) == edge->outputs_[0]->path()");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&edge + 7));
        bVar5 = ((bVar5 ^ 0xffU) & 1) != 0;
        if (bVar5) {
          testing::Test::AddAssertionFailure(g_current_test);
        }
        edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node._1_3_ = 0;
        edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node._0_1_ = bVar5;
        std::__cxx11::string::~string((string *)local_1b0);
        if ((uint)edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node != 0) goto LAB_00129b39;
      }
      ppEVar8 = std::deque<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          ((deque<Edge_*,_std::allocator<Edge_*>_> *)local_180,4);
      pEVar1 = *ppEVar8;
      bVar5 = testing::Test::Check
                        (g_current_test,pEVar1 != (value_type)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0x12d,"edge");
      pTVar3 = g_current_test;
      if (bVar5) {
        ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pEVar1->inputs_,0);
        psVar10 = Node::path_abi_cxx11_(*ppNVar9);
        bVar5 = std::operator==("in",psVar10);
        bVar5 = testing::Test::Check
                          (pTVar3,bVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x12e,"\"in\" == edge->inputs_[0]->path()");
        pTVar3 = g_current_test;
        if (bVar5) {
          ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pEVar1->outputs_,0);
          psVar10 = Node::path_abi_cxx11_(*ppNVar9);
          bVar5 = std::operator==("outb3",psVar10);
          bVar5 = testing::Test::Check
                            (pTVar3,bVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0x12f,"\"outb3\" == edge->outputs_[0]->path()");
          if (bVar5) {
            ppEVar8 = std::deque<Edge_*,_std::allocator<Edge_*>_>::front
                                ((deque<Edge_*,_std::allocator<Edge_*>_> *)local_180);
            Plan::EdgeFinished(&(this->super_PlanTest).plan_,*ppEVar8,kEdgeSucceeded,
                               (string *)local_108);
            pTVar3 = g_current_test;
            bVar5 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_108);
            bVar5 = testing::Test::Check
                              (pTVar3,bVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0x133,"\"\" == err");
            if (bVar5) {
              std::deque<Edge_*,_std::allocator<Edge_*>_>::pop_front
                        ((deque<Edge_*,_std::allocator<Edge_*>_> *)local_180);
              it._M_node = (_Map_pointer)Plan::FindWork(&(this->super_PlanTest).plan_);
              bVar5 = testing::Test::Check
                                (g_current_test,(Edge *)it._M_node != (Edge *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                 ,0x138,"out3");
              pTVar3 = g_current_test;
              if (bVar5) {
                ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                    ((vector<Node_*,_std::allocator<Node_*>_> *)(it._M_node + 2),0);
                psVar10 = Node::path_abi_cxx11_(*ppNVar9);
                bVar5 = std::operator==("in",psVar10);
                bVar5 = testing::Test::Check
                                  (pTVar3,bVar5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                   ,0x139,"\"in\" == out3->inputs_[0]->path()");
                pTVar3 = g_current_test;
                if (bVar5) {
                  ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                      ((vector<Node_*,_std::allocator<Node_*>_> *)(it._M_node + 5),0
                                      );
                  psVar10 = Node::path_abi_cxx11_(*ppNVar9);
                  bVar5 = std::operator==("out3",psVar10);
                  bVar5 = testing::Test::Check
                                    (pTVar3,bVar5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                     ,0x13a,"\"out3\" == out3->outputs_[0]->path()");
                  pTVar3 = g_current_test;
                  if (bVar5) {
                    pEVar11 = Plan::FindWork(&(this->super_PlanTest).plan_);
                    bVar5 = testing::Test::Check
                                      (pTVar3,pEVar11 == (Edge *)0x0,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                       ,0x13c,"plan_.FindWork()");
                    if (bVar5) {
                      Plan::EdgeFinished(&(this->super_PlanTest).plan_,(Edge *)it._M_node,
                                         kEdgeSucceeded,(string *)local_108);
                      pTVar3 = g_current_test;
                      bVar5 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108);
                      bVar5 = testing::Test::Check
                                        (pTVar3,bVar5,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                         ,0x13f,"\"\" == err");
                      pTVar3 = g_current_test;
                      if (bVar5) {
                        pEVar11 = Plan::FindWork(&(this->super_PlanTest).plan_);
                        bVar5 = testing::Test::Check
                                          (pTVar3,pEVar11 == (Edge *)0x0,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                           ,0x141,"plan_.FindWork()");
                        if (bVar5) {
                          std::deque<Edge_*,_std::allocator<Edge_*>_>::begin
                                    ((iterator *)local_230,
                                     (deque<Edge_*,_std::allocator<Edge_*>_> *)local_180);
                          while( true ) {
                            std::deque<Edge_*,_std::allocator<Edge_*>_>::end
                                      ((iterator *)&last,
                                       (deque<Edge_*,_std::allocator<Edge_*>_> *)local_180);
                            bVar5 = std::operator!=((_Self *)local_230,(_Self *)&last);
                            if (!bVar5) break;
                            ppEVar12 = std::_Deque_iterator<Edge_*,_Edge_*&,_Edge_**>::operator*
                                                 ((_Deque_iterator<Edge_*,_Edge_*&,_Edge_**> *)
                                                  local_230);
                            Plan::EdgeFinished(&(this->super_PlanTest).plan_,*ppEVar12,
                                               kEdgeSucceeded,(string *)local_108);
                            pTVar3 = g_current_test;
                            bVar5 = std::operator==("",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108);
                            bVar5 = testing::Test::Check
                                              (pTVar3,bVar5,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                               ,0x145,"\"\" == err");
                            if (!bVar5) {
                              testing::Test::AddAssertionFailure(g_current_test);
                              edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                              goto LAB_00129b39;
                            }
                            std::_Deque_iterator<Edge_*,_Edge_*&,_Edge_**>::operator++
                                      ((_Deque_iterator<Edge_*,_Edge_*&,_Edge_**> *)local_230);
                          }
                          pEVar11 = Plan::FindWork(&(this->super_PlanTest).plan_);
                          bVar5 = testing::Test::Check
                                            (g_current_test,pEVar11 != (Edge *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                             ,0x149,"last");
                          pTVar3 = g_current_test;
                          if (bVar5) {
                            ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                                (&pEVar11->outputs_,0);
                            psVar10 = Node::path_abi_cxx11_(*ppNVar9);
                            bVar5 = std::operator==("allTheThings",psVar10);
                            bVar5 = testing::Test::Check
                                              (pTVar3,bVar5,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                               ,0x14a,
                                               "\"allTheThings\" == last->outputs_[0]->path()");
                            if (bVar5) {
                              Plan::EdgeFinished(&(this->super_PlanTest).plan_,pEVar11,
                                                 kEdgeSucceeded,(string *)local_108);
                              pTVar3 = g_current_test;
                              bVar5 = std::operator==("",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108);
                              bVar5 = testing::Test::Check
                                                (pTVar3,bVar5,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                                 ,0x14d,"\"\" == err");
                              pTVar3 = g_current_test;
                              if (bVar5) {
                                bVar5 = Plan::more_to_do(&(this->super_PlanTest).plan_);
                                bVar5 = testing::Test::Check
                                                  (pTVar3,(bool)(~bVar5 & 1),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                                  ,0x14f,"plan_.more_to_do()");
                                pTVar3 = g_current_test;
                                if (bVar5) {
                                  pEVar11 = Plan::FindWork(&(this->super_PlanTest).plan_);
                                  bVar5 = testing::Test::Check
                                                    (pTVar3,pEVar11 == (Edge *)0x0,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                                  ,0x150,"plan_.FindWork()");
                                  if (bVar5) {
                                    edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
                                    .super__Deque_impl_data._M_finish._M_node._0_4_ = 0;
                                  }
                                  else {
                                    testing::Test::AddAssertionFailure(g_current_test);
                                    edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
                                    .super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                                  }
                                }
                                else {
                                  testing::Test::AddAssertionFailure(g_current_test);
                                  edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                  super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                                }
                              }
                              else {
                                testing::Test::AddAssertionFailure(g_current_test);
                                edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                              }
                            }
                            else {
                              testing::Test::AddAssertionFailure(g_current_test);
                              edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                            }
                          }
                          else {
                            testing::Test::AddAssertionFailure(g_current_test);
                            edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                          }
                        }
                        else {
                          testing::Test::AddAssertionFailure(g_current_test);
                          edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                        }
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_node._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node._0_4_ = 1;
      }
LAB_00129b39:
      std::deque<Edge_*,_std::allocator<Edge_*>_>::~deque
                ((deque<Edge_*,_std::allocator<Edge_*>_> *)local_180);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_108);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(PlanTest, PoolsWithDepthTwo) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"pool foobar\n"
"  depth = 2\n"
"pool bazbin\n"
"  depth = 2\n"
"rule foocat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"rule bazcat\n"
"  command = cat $in > $out\n"
"  pool = bazbin\n"
"build out1: foocat in\n"
"build out2: foocat in\n"
"build out3: foocat in\n"
"build outb1: bazcat in\n"
"build outb2: bazcat in\n"
"build outb3: bazcat in\n"
"  pool =\n"
"build allTheThings: cat out1 out2 out3 outb1 outb2 outb3\n"
));
  // Mark all the out* nodes dirty
  for (int i = 0; i < 3; ++i) {
    GetNode("out" + string(1, '1' + static_cast<char>(i)))->MarkDirty();
    GetNode("outb" + string(1, '1' + static_cast<char>(i)))->MarkDirty();
  }
  GetNode("allTheThings")->MarkDirty();

  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("allTheThings"), &err));
  ASSERT_EQ("", err);

  deque<Edge*> edges;
  FindWorkSorted(&edges, 5);

  for (int i = 0; i < 4; ++i) {
    Edge *edge = edges[i];
    ASSERT_EQ("in",  edge->inputs_[0]->path());
    string base_name(i < 2 ? "out" : "outb");
    ASSERT_EQ(base_name + string(1, '1' + (i % 2)), edge->outputs_[0]->path());
  }

  // outb3 is exempt because it has an empty pool
  Edge* edge = edges[4];
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("outb3", edge->outputs_[0]->path());

  // finish out1
  plan_.EdgeFinished(edges.front(), Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);
  edges.pop_front();

  // out3 should be available
  Edge* out3 = plan_.FindWork();
  ASSERT_TRUE(out3);
  ASSERT_EQ("in",  out3->inputs_[0]->path());
  ASSERT_EQ("out3", out3->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(out3, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.FindWork());

  for (deque<Edge*>::iterator it = edges.begin(); it != edges.end(); ++it) {
    plan_.EdgeFinished(*it, Plan::kEdgeSucceeded, &err);
    ASSERT_EQ("", err);
  }

  Edge* last = plan_.FindWork();
  ASSERT_TRUE(last);
  ASSERT_EQ("allTheThings", last->outputs_[0]->path());

  plan_.EdgeFinished(last, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.more_to_do());
  ASSERT_FALSE(plan_.FindWork());
}